

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing_reorder.cpp
# Opt level: O1

spv_result_t
spvtools::val::ValidateHitObjectPointer
          (ValidationState_t *_,Instruction *inst,uint32_t hit_object_index)

{
  uint uVar1;
  Instruction *pIVar2;
  long lVar3;
  char *pcVar4;
  DiagnosticStream DStack_1f8;
  
  uVar1 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)hit_object_index);
  pIVar2 = ValidationState_t::FindDef(_,uVar1);
  uVar1 = (pIVar2->inst_).opcode - 0x37;
  if ((uVar1 < 0xb) && ((0x411U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar1 = Instruction::GetOperandAs<unsigned_int>(pIVar2,0);
    pIVar2 = ValidationState_t::FindDef(_,uVar1);
    if ((pIVar2 == (Instruction *)0x0) || ((pIVar2->inst_).opcode != 0x20)) {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar4 = "Hit Object must be a pointer";
      lVar3 = 0x1c;
    }
    else {
      uVar1 = Instruction::GetOperandAs<unsigned_int>(pIVar2,2);
      pIVar2 = ValidationState_t::FindDef(_,uVar1);
      if ((pIVar2 != (Instruction *)0x0) && ((pIVar2->inst_).opcode == 0x14a1)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar4 = "Type must be OpTypeHitObjectNV";
      lVar3 = 0x1e;
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar4 = "Hit Object must be a memory object declaration";
    lVar3 = 0x2e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar4,lVar3);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateHitObjectPointer(ValidationState_t& _,
                                      const Instruction* inst,
                                      uint32_t hit_object_index) {
  const uint32_t hit_object_id = inst->GetOperandAs<uint32_t>(hit_object_index);
  auto variable = _.FindDef(hit_object_id);
  const auto var_opcode = variable->opcode();
  if (!variable || (var_opcode != spv::Op::OpVariable &&
                    var_opcode != spv::Op::OpFunctionParameter &&
                    var_opcode != spv::Op::OpAccessChain)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Hit Object must be a memory object declaration";
  }
  auto pointer = _.FindDef(variable->GetOperandAs<uint32_t>(0));
  if (!pointer || pointer->opcode() != spv::Op::OpTypePointer) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Hit Object must be a pointer";
  }
  auto type = _.FindDef(pointer->GetOperandAs<uint32_t>(2));
  if (!type || type->opcode() != spv::Op::OpTypeHitObjectNV) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Type must be OpTypeHitObjectNV";
  }
  return SPV_SUCCESS;
}